

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::Texture1DArrayView::sampleCompare
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  float fVar1;
  IVec2 local_20;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_20.m_data[1] = selectLayer(this,t);
  local_20.m_data[0] = 0;
  fVar1 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_20);
  return fVar1;
}

Assistant:

float Texture1DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float lod) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(0, selectLayer(t)));
}